

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

bool __thiscall kratos::Context::is_unique(Context *this,Generator *gen)

{
  long lVar1;
  const_iterator cVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  
  if (gen != (Generator *)0x0) {
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,&gen->name);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      cVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,&gen->name);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = *(_Rb_tree_node_base **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                       ._M_cur + 0x40);
      if (p_Var3 != (_Rb_tree_node_base *)
                    ((long)cVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                           ._M_cur + 0x30)) {
        lVar4 = 0;
        do {
          lVar1 = *(long *)(p_Var3 + 1);
          if ((*(long *)(lVar1 + 0xe0) == *(long *)(lVar1 + 0xe8)) &&
             ((*(byte *)(lVar1 + 0x2d9) & 1) == 0)) {
            lVar4 = lVar4 + ((ulong)*(byte *)(lVar1 + 0x318) ^ 1);
          }
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        } while (p_Var3 != (_Rb_tree_node_base *)
                           ((long)cVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                                  ._M_cur + 0x30));
        return lVar4 == 1;
      }
    }
  }
  return false;
}

Assistant:

bool Context::is_unique(kratos::Generator *gen) const {
    if (gen == nullptr) return false;
    if (modules_.find(gen->name) == modules_.end()) return false;
    auto const &gens = modules_.at(gen->name);
    uint64_t c = 0;
    for (auto const &g : gens) {
        if (!g->external() && !g->is_cloned()) {
            c++;
        }
    }
    return c == 1;
}